

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderFrameBorder(ImVec2 p_min,ImVec2 p_max,float rounding)

{
  ImDrawList *pIVar1;
  ImU32 IVar2;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  float local_34;
  ImGuiWindow *pIStack_30;
  float border_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 IStack_18;
  float rounding_local;
  ImVec2 p_max_local;
  ImVec2 p_min_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_30 = GImGui->CurrentWindow;
  local_34 = (GImGui->Style).FrameBorderSize;
  if (0.0 < local_34) {
    pIVar1 = pIStack_30->DrawList;
    g._4_4_ = rounding;
    IStack_18 = p_max;
    p_max_local = p_min;
    ImVec2::ImVec2(&local_44,1.0,1.0);
    local_3c = ::operator+(&p_max_local,&local_44);
    ImVec2::ImVec2(&local_54,1.0,1.0);
    local_4c = ::operator+(&stack0xffffffffffffffe8,&local_54);
    IVar2 = GetColorU32(6,1.0);
    ImDrawList::AddRect(pIVar1,&local_3c,&local_4c,IVar2,g._4_4_,0,local_34);
    pIVar1 = pIStack_30->DrawList;
    IVar2 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar1,&p_max_local,&stack0xffffffffffffffe8,IVar2,g._4_4_,0,local_34);
  }
  return;
}

Assistant:

void ImGui::RenderFrameBorder(ImVec2 p_min, ImVec2 p_max, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const float border_size = g.Style.FrameBorderSize;
    if (border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, 0, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, 0, border_size);
    }
}